

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_request.c
# Opt level: O3

int tnt_request_set_tuple_format(tnt_request *req,char *fmt,...)

{
  long *plVar1;
  char *pcVar2;
  char in_AL;
  tnt_stream *ptVar3;
  ssize_t sVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined1 local_38 [8];
  va_list args;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (req->tuple_object == (tnt_stream *)0x0) {
    ptVar3 = tnt_object((tnt_stream *)0x0);
    req->tuple_object = ptVar3;
  }
  else {
    tnt_object_reset(req->tuple_object);
    ptVar3 = req->tuple_object;
  }
  if (ptVar3 != (tnt_stream *)0x0) {
    args[0].overflow_arg_area = local_e8;
    args[0]._0_8_ = &stack0x00000008;
    local_38._0_4_ = 0x10;
    local_38._4_4_ = 0x30;
    sVar4 = tnt_object_vformat(req->tuple_object,fmt,(__va_list_tag *)local_38);
    if (sVar4 != -1) {
      plVar1 = (long *)req->tuple_object->data;
      pcVar2 = (char *)*plVar1;
      req->tuple = pcVar2;
      req->tuple_end = pcVar2 + plVar1[1];
      return 0;
    }
  }
  return -1;
}

Assistant:

int tnt_request_set_tuple_format(struct tnt_request *req, const char *fmt, ...)
{
	if (req->tuple_object)
		tnt_object_reset(req->tuple_object);
	else
		req->tuple_object = tnt_object(NULL);
	if (!req->tuple_object)
		return -1;
	va_list args;
	va_start(args, fmt);
	ssize_t res = tnt_object_vformat(req->tuple_object, fmt, args);
	va_end(args);
	if (res == -1)
		return -1;
	return tnt_request_set_tuple(req, req->tuple_object);
}